

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O0

void __thiscall
dg::pta::PointerAnalysisFI::getMemoryObjects
          (PointerAnalysisFI *this,PSNode *where,Pointer *pointer,
          vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *objects)

{
  PSNodeType PVar1;
  MemoryObject *newdata;
  undefined8 *in_RDX;
  MemoryObject *in_RDI;
  Pointer PVar2;
  MemoryObject *mo;
  PSNode *n;
  const_iterator *in_stack_ffffffffffffff98;
  vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>
  *in_stack_ffffffffffffffb0;
  PSNode *local_38;
  PSNode *local_28;
  
  local_28 = (PSNode *)*in_RDX;
  PVar1 = PSNode::getType(local_28);
  if ((PVar1 == CAST) || (PVar1 = PSNode::getType(local_28), PVar1 == GEP)) {
    local_28 = SubgraphNode<dg::pta::PSNode>::getOperand
                         ((SubgraphNode<dg::pta::PSNode> *)in_RDI,(size_t)in_stack_ffffffffffffff98)
    ;
  }
  else {
    PVar1 = PSNode::getType(local_28);
    if (PVar1 == CONSTANT) {
      PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_RDI);
      PVar2 = PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff98);
      local_38 = PVar2.target;
      local_28 = local_38;
    }
  }
  PVar1 = PSNode::getType(local_28);
  if (PVar1 != FUNCTION) {
    newdata = SubgraphNode<dg::pta::PSNode>::getData<dg::pta::MemoryObject>
                        ((SubgraphNode<dg::pta::PSNode> *)(local_28 + 8));
    if (newdata == (MemoryObject *)0x0) {
      newdata = (MemoryObject *)operator_new(0x38);
      MemoryObject::MemoryObject(in_RDI,(PSNode *)newdata);
      std::
      vector<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::allocator<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>
      ::emplace_back<dg::pta::MemoryObject*&>
                ((vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                  *)in_stack_ffffffffffffffb0,(MemoryObject **)newdata);
      SubgraphNode<dg::pta::PSNode>::setData<dg::pta::MemoryObject>
                ((SubgraphNode<dg::pta::PSNode> *)(local_28 + 8),newdata);
    }
    std::vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>::push_back
              (in_stack_ffffffffffffffb0,(value_type *)newdata);
  }
  return;
}

Assistant:

void getMemoryObjects(PSNode *where, const Pointer &pointer,
                          std::vector<MemoryObject *> &objects) override {
        // irrelevant in flow-insensitive
        (void) where;
        PSNode *n = pointer.target;

        // we want to have memory in allocation sites
        if (n->getType() == PSNodeType::CAST || n->getType() == PSNodeType::GEP)
            n = n->getOperand(0);
        else if (n->getType() == PSNodeType::CONSTANT) {
            assert(n->pointsTo.size() == 1);
            n = (*n->pointsTo.begin()).target;
        }

        if (n->getType() == PSNodeType::FUNCTION)
            return;

        assert(n->getType() == PSNodeType::ALLOC ||
               n->getType() == PSNodeType::UNKNOWN_MEM);

        MemoryObject *mo = n->getData<MemoryObject>();
        if (!mo) {
            mo = new MemoryObject(n);
            memory_objects.emplace_back(mo);
            n->setData<MemoryObject>(mo);
        }

        objects.push_back(mo);
    }